

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::processCancel(Application *this,string *id,string *symbol,Side side)

{
  Order *order;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)symbol);
  std::__cxx11::string::string((string *)&local_60,(string *)id);
  order = OrderMatcher::find(&this->m_orderMatcher,&local_40,side,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  order->m_openQuantity = 0;
  cancelOrder(this,order);
  OrderMatcher::erase(&this->m_orderMatcher,order);
  return;
}

Assistant:

void Application::processCancel(const std::string &id, const std::string &symbol, Order::Side side) {
  Order &order = m_orderMatcher.find(symbol, side, id);
  order.cancel();
  cancelOrder(order);
  m_orderMatcher.erase(order);
}